

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall reduceDB_lt::operator()(reduceDB_lt *this,CRef x,CRef y)

{
  float fVar1;
  int iVar2;
  Clause *pCVar3;
  float *pfVar4;
  bool local_29;
  bool local_19;
  CRef y_local;
  CRef x_local;
  reduceDB_lt *this_local;
  
  pCVar3 = Minisat::ClauseAllocator::operator[](this->ca,x);
  iVar2 = Minisat::Clause::size(pCVar3);
  local_19 = false;
  if (2 < iVar2) {
    pCVar3 = Minisat::ClauseAllocator::operator[](this->ca,y);
    iVar2 = Minisat::Clause::size(pCVar3);
    local_29 = true;
    if (iVar2 != 2) {
      pCVar3 = Minisat::ClauseAllocator::operator[](this->ca,x);
      pfVar4 = Minisat::Clause::activity(pCVar3);
      fVar1 = *pfVar4;
      pCVar3 = Minisat::ClauseAllocator::operator[](this->ca,y);
      pfVar4 = Minisat::Clause::activity(pCVar3);
      local_29 = fVar1 < *pfVar4;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool operator () (CRef x, CRef y) { 
        return ca[x].size() > 2 && (ca[y].size() == 2 || ca[x].activity() < ca[y].activity()); }